

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_sampler_parameterIuiv
               (NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  NotSupportedError *this;
  allocator<char> local_39;
  GLuint borderColor;
  GLuint sampler;
  string local_30;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    sampler = 0x1234;
    borderColor = 0x1234;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "GL_INVALID_OPERATION is generated if sampler is not the name of a sampler object returned from a previous call to ctx.glGenSamplers."
               ,&local_39);
    NegativeTestContext::beginSection(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    glu::CallLogWrapper::glGetSamplerParameterIuiv
              (&ctx->super_CallLogWrapper,0x1234,0x1004,&borderColor);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glGenSamplers(&ctx->super_CallLogWrapper,1,&sampler);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_INVALID_ENUM is generated if pname is not an accepted value."
               ,&local_39);
    NegativeTestContext::beginSection(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    glu::CallLogWrapper::glGetSamplerParameterIuiv
              (&ctx->super_CallLogWrapper,sampler,0xffffffff,&borderColor);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glDeleteSamplers(&ctx->super_CallLogWrapper,1,&sampler);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"glGetSamplerParameterIuiv is not supported.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderApiTests.cpp"
             ,0x2a8);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void get_sampler_parameterIuiv (NegativeTestContext& ctx)
{
	if (!contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		throw tcu::NotSupportedError("glGetSamplerParameterIuiv is not supported.", DE_NULL, __FILE__, __LINE__);

	GLuint	sampler		= 0x1234;
	GLuint	borderColor	= 0x1234;

	ctx.beginSection("GL_INVALID_OPERATION is generated if sampler is not the name of a sampler object returned from a previous call to ctx.glGenSamplers.");
	ctx.glGetSamplerParameterIuiv(sampler, GL_TEXTURE_BORDER_COLOR, &borderColor);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glGenSamplers(1, &sampler);

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted value.");
	ctx.glGetSamplerParameterIuiv(sampler, -1, &borderColor);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glDeleteSamplers(1, &sampler);
}